

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O1

void __thiscall ResolverThread::func(ResolverThread *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  EventLoop *this_00;
  _List_node_base **pp_Var3;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  name;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  handler;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  port;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  request;
  _List_node_base local_180;
  _List_node_base *local_170;
  _List_node_base local_168;
  _List_node_base *local_158;
  _Any_data local_150;
  _List_node_base *local_140;
  _List_node_base *p_Stack_138;
  ResolverThread *local_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
  *local_100;
  string local_f8;
  _Any_data local_d8;
  code *local_c8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  EventLoop *local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (((this->keep_running)._M_base._M_i & 1U) != 0) {
    local_100 = &this->requests_;
    local_130 = this;
    do {
      Liby::
      BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
      ::pop_wait((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                  *)&local_98,local_100);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_50,local_50 + local_48);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_70,local_70 + local_68);
      this_00 = local_78;
      std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
      function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                *)&local_d8,
               (function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                *)&local_98);
      if (local_c8 != (code *)0x0) {
        local_170 = (_List_node_base *)0x0;
        local_180._M_next = &local_180;
        local_180._M_prev = &local_180;
        Liby::Resolver::resolve
                  ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_168,&local_f8,
                   &local_b8);
        p_Var2 = local_180._M_next;
        while (p_Var2 != &local_180) {
          p_Var1 = (((_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&p_Var2->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var2);
          p_Var2 = p_Var1;
        }
        local_170 = (_List_node_base *)0x0;
        if (local_168._M_next == &local_168) {
          pp_Var3 = &local_170;
          local_180._M_next = &local_180;
          local_180._M_prev = &local_180;
        }
        else {
          (local_168._M_prev)->_M_next = &local_180;
          (local_168._M_next)->_M_prev = &local_180;
          local_170 = local_158;
          pp_Var3 = &local_158;
          local_180._M_next = local_168._M_next;
          local_180._M_prev = local_168._M_prev;
          local_168._M_next = &local_168;
          local_168._M_prev = &local_168;
        }
        *pp_Var3 = (_List_node_base *)0x0;
        p_Var2 = local_168._M_next;
        while (p_Var2 != &local_168) {
          p_Var1 = p_Var2->_M_next;
          operator_delete(p_Var2);
          p_Var2 = p_Var1;
        }
        std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::list
                  ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_168,
                   (list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_180);
        std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
        function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                  *)&local_150,
                 (function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                  *)&local_d8);
        local_118 = (code *)0x0;
        pcStack_110 = (code *)0x0;
        local_128._M_unused._M_object = (void *)0x0;
        local_128._8_8_ = 0;
        local_128._M_unused._M_object = operator_new(0x38);
        ((_List_node_base *)local_128._M_unused._0_8_)->_M_next = local_168._M_next;
        ((_List_node_base *)local_128._M_unused._0_8_)->_M_prev = local_168._M_prev;
        ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x10))->_M_next = local_158;
        if (local_168._M_next == &local_168) {
          ((_List_node_base *)local_128._M_unused._0_8_)->_M_prev =
               (_List_node_base *)local_128._M_unused._0_8_;
          ((_List_node_base *)local_128._M_unused._0_8_)->_M_next =
               (_List_node_base *)local_128._M_unused._0_8_;
        }
        else {
          (local_168._M_prev)->_M_next = (_List_node_base *)local_128._M_unused._0_8_;
          ((_List_node_base *)local_128._M_unused._0_8_)->_M_next->_M_prev =
               (_List_node_base *)local_128._M_unused._0_8_;
          local_158 = (_List_node_base *)0x0;
          local_168._M_next = &local_168;
          local_168._M_prev = &local_168;
        }
        ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x10))->_M_prev =
             (_List_node_base *)0x0;
        ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x20))->_M_next =
             (_List_node_base *)0x0;
        ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x20))->_M_prev =
             (_List_node_base *)0x0;
        ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x30))->_M_next = p_Stack_138;
        if (local_140 != (_List_node_base *)0x0) {
          ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x10))->_M_prev =
               (_List_node_base *)local_150._M_unused._0_8_;
          ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x20))->_M_next =
               (_List_node_base *)local_150._8_8_;
          ((_List_node_base *)((long)local_128._M_unused._0_8_ + 0x20))->_M_prev = local_140;
          local_140 = (_List_node_base *)0x0;
          p_Stack_138 = (_List_node_base *)0x0;
        }
        pcStack_110 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:53:31)>
                      ::_M_invoke;
        local_118 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:53:31)>
                    ::_M_manager;
        Liby::EventLoop::runEventHandler(this_00,(BasicHandler *)&local_128);
        if (local_118 != (code *)0x0) {
          (*local_118)(&local_128,&local_128,__destroy_functor);
        }
        p_Var2 = local_168._M_next;
        if (local_140 != (_List_node_base *)0x0) {
          (*(code *)local_140)(&local_150,&local_150,__destroy_functor);
          p_Var2 = local_168._M_next;
        }
        while (p_Var1 = local_180._M_next, p_Var2 != &local_168) {
          p_Var1 = p_Var2->_M_next;
          operator_delete(p_Var2);
          p_Var2 = p_Var1;
        }
        while (p_Var1 != &local_180) {
          p_Var2 = p_Var1->_M_next;
          operator_delete(p_Var1);
          p_Var1 = p_Var2;
        }
      }
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
    } while (((local_130->keep_running)._M_base._M_i & 1U) != 0);
  }
  return;
}

Assistant:

void ResolverThread::func() {
    while (keep_running) {
        auto request = requests_.pop_wait();
        auto name = std::get<0>(request);
        auto port = std::get<1>(request);
        auto loop = std::get<2>(request);
        auto handler = std::get<3>(request);

        if (!handler) {
            continue;
        }

        std::list<Endpoint> eps;

        try {
            eps = Resolver::resolve(name, port);
        } catch (const char *err) { debug("resolver error: %s", err); }

        loop->runEventHandler([eps, handler] { handler(eps); });
    }
}